

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

bool __thiscall QTextDocumentPrivate::split(QTextDocumentPrivate *this,int pos)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  Header *pHVar4;
  QTextFragmentData *pQVar5;
  uint p_1;
  uint uVar6;
  uint uVar7;
  int iVar8;
  FragmentMap *this_00;
  int iVar9;
  uint p;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  
  this_00 = &this->fragments;
  uVar6 = QFragmentMapData<QTextFragmentData>::findNode(&this_00->data,pos,0);
  if (uVar6 == 0) {
    return false;
  }
  pHVar4 = (this_00->data).field_0.head;
  uVar13 = (ulong)uVar6;
  lVar14 = uVar13 * 0x20;
  uVar7 = *(uint *)((long)pHVar4 + lVar14);
  iVar9 = *(int *)((long)pHVar4 + lVar14 + 0x10);
  uVar3 = uVar7;
  uVar10 = uVar6;
  if (uVar7 == 0) {
    iVar9 = pos - iVar9;
    if (iVar9 == 0) {
      return false;
    }
    iVar8 = *(int *)((long)pHVar4 + lVar14 + 0x14);
    *(int *)((long)pHVar4 + lVar14 + 0x14) = iVar9;
  }
  else {
    do {
      uVar11 = uVar3;
      lVar12 = (ulong)uVar11 * 0x20;
      puVar2 = (uint *)((long)pHVar4 + lVar12);
      if (*(uint *)((long)pHVar4 + lVar12 + 8) == uVar10) {
        iVar9 = iVar9 + puVar2[4] + puVar2[5];
      }
      uVar3 = *puVar2;
      uVar10 = uVar11;
    } while (*puVar2 != 0);
    iVar9 = pos - iVar9;
    if (iVar9 == 0) {
      return false;
    }
    iVar8 = *(int *)((long)pHVar4 + lVar14 + 0x14);
    *(int *)((long)pHVar4 + lVar14 + 0x14) = iVar9;
    do {
      pHVar4 = (this_00->data).field_0.head;
      puVar2 = (uint *)((long)pHVar4 + (ulong)uVar7 * 0x20);
      if (*(uint *)((long)pHVar4 + (ulong)uVar7 * 0x20 + 4) == uVar6) {
        puVar1 = puVar2 + 4;
        *puVar1 = *puVar1 + (iVar9 - iVar8);
      }
      uVar3 = *puVar2;
      uVar6 = uVar7;
      uVar7 = uVar3;
    } while (uVar3 != 0);
  }
  uVar6 = QFragmentMapData<QTextFragmentData>::insert_single(&this_00->data,pos,iVar8 - iVar9);
  pQVar5 = (this_00->data).field_0.fragments;
  pQVar5[uVar6].stringPosition = iVar9 + pQVar5[uVar13].stringPosition;
  pQVar5[uVar6].format = pQVar5[uVar13].format;
  return true;
}

Assistant:

bool QTextDocumentPrivate::split(int pos)
{
    uint x = fragments.findNode(pos);
    if (x) {
        int k = fragments.position(x);
//          qDebug("found fragment with key %d, size_left=%d, size=%d to split at %d",
//                k, (*it)->size_left[0], (*it)->size_array[0], pos);
        if (k != pos) {
            Q_ASSERT(k <= pos);
            // need to resize the first fragment and add a new one
            QTextFragmentData *X = fragments.fragment(x);
            int oldsize = X->size_array[0];
            fragments.setSize(x, pos-k);
            uint n = fragments.insert_single(pos, oldsize-(pos-k));
            X = fragments.fragment(x);
            QTextFragmentData *N = fragments.fragment(n);
            N->stringPosition = X->stringPosition + pos-k;
            N->format = X->format;
            return true;
        }
    }
    return false;
}